

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
::find_or_prepare_insert_non_soo<char[5]>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
          *this,char (*key) [5])

{
  ctrl_t *pcVar1;
  void *pvVar2;
  uint uVar3;
  ushort uVar4;
  ctrl_t cVar5;
  ctrl_t cVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  bool bVar37;
  char cVar38;
  ushort uVar39;
  size_t size;
  MixingHashState MVar40;
  long lVar41;
  ctrl_t *pcVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  anon_union_8_1_a8a14541_for_iterator_2 aVar46;
  bool bVar47;
  uint64_t v;
  ulong uVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  FindInfo FVar53;
  __m128i match;
  ulong local_b0;
  _Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_98;
  _Head_base<0UL,_const_google::protobuf::FieldDescriptorProto_Type_&,_false> local_90;
  ulong local_88;
  ulong local_80;
  char (*local_78) [5];
  ctrl_t *local_70;
  undefined1 local_68 [16];
  char (*local_58) [5];
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
  *local_50;
  ctrl_t local_48;
  ctrl_t cStack_47;
  ctrl_t cStack_46;
  ctrl_t cStack_45;
  ctrl_t cStack_44;
  ctrl_t cStack_43;
  ctrl_t cStack_42;
  ctrl_t cStack_41;
  ctrl_t cStack_40;
  ctrl_t cStack_3f;
  ctrl_t cStack_3e;
  ctrl_t cStack_3d;
  ctrl_t cStack_3c;
  ctrl_t cStack_3b;
  ctrl_t cStack_3a;
  ctrl_t cStack_39;
  
  size = strlen(*key);
  local_78 = key;
  MVar40 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,(uchar *)key,size);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = MVar40.state_ + size;
  uVar44 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if ((uVar44 + 1 & uVar44) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar49 = SUB168(auVar50 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar50 * ZEXT816(0x9ddfea08eb382d69),0);
  local_70 = (this->settings_).
             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
  uVar48 = (uVar49 >> 7 ^ (ulong)local_70 >> 0xc) & uVar44;
  auVar50 = ZEXT216(CONCAT11((char)uVar49,(char)uVar49) & 0x7f7f);
  auVar50 = pshuflw(auVar50,auVar50,0);
  local_68._0_4_ = auVar50._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  pcVar42 = (__return_storage_ptr__->first).ctrl_;
  aVar46 = (__return_storage_ptr__->first).field_1;
  bVar47 = __return_storage_ptr__->second;
  local_b0 = 0;
  do {
    pcVar1 = local_70 + uVar48;
    auVar51[0] = -(local_68[0] == *pcVar1);
    auVar51[1] = -(local_68[1] == pcVar1[1]);
    auVar51[2] = -(local_68[2] == pcVar1[2]);
    auVar51[3] = -(local_68[3] == pcVar1[3]);
    auVar51[4] = -(local_68[4] == pcVar1[4]);
    auVar51[5] = -(local_68[5] == pcVar1[5]);
    auVar51[6] = -(local_68[6] == pcVar1[6]);
    auVar51[7] = -(local_68[7] == pcVar1[7]);
    auVar51[8] = -(local_68[8] == pcVar1[8]);
    auVar51[9] = -(local_68[9] == pcVar1[9]);
    auVar51[10] = -(local_68[10] == pcVar1[10]);
    auVar51[0xb] = -(local_68[0xb] == pcVar1[0xb]);
    auVar51[0xc] = -(local_68[0xc] == pcVar1[0xc]);
    auVar51[0xd] = -(local_68[0xd] == pcVar1[0xd]);
    auVar51[0xe] = -(local_68[0xe] == pcVar1[0xe]);
    auVar51[0xf] = -(local_68[0xf] == pcVar1[0xf]);
    uVar39 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(auVar51[0xf] >> 7) << 0xf;
    uVar43 = (uint)uVar39;
    cVar21 = *pcVar1;
    cVar22 = pcVar1[1];
    cVar23 = pcVar1[2];
    cVar24 = pcVar1[3];
    cVar25 = pcVar1[4];
    cVar26 = pcVar1[5];
    cVar27 = pcVar1[6];
    cVar28 = pcVar1[7];
    cVar29 = pcVar1[8];
    cVar30 = pcVar1[9];
    cVar31 = pcVar1[10];
    cVar32 = pcVar1[0xb];
    cVar33 = pcVar1[0xc];
    cVar34 = pcVar1[0xd];
    cVar35 = pcVar1[0xe];
    cVar36 = pcVar1[0xf];
    cVar5 = local_48;
    cVar6 = cStack_47;
    cVar7 = cStack_46;
    cVar8 = cStack_45;
    cVar9 = cStack_44;
    cVar10 = cStack_43;
    cVar11 = cStack_42;
    cVar12 = cStack_41;
    cVar13 = cStack_40;
    cVar14 = cStack_3f;
    cVar15 = cStack_3e;
    cVar16 = cStack_3d;
    cVar17 = cStack_3c;
    cVar18 = cStack_3b;
    cVar19 = cStack_3a;
    cVar20 = cStack_39;
    while (cStack_39 = cVar36, cStack_3a = cVar35, cStack_3b = cVar34, cStack_3c = cVar33,
          cStack_3d = cVar32, cStack_3e = cVar31, cStack_3f = cVar30, cStack_40 = cVar29,
          cStack_41 = cVar28, cStack_42 = cVar27, cStack_43 = cVar26, cStack_44 = cVar25,
          cStack_45 = cVar24, cStack_46 = cVar23, cStack_47 = cVar22, local_48 = cVar21, uVar39 != 0
          ) {
      uVar3 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      lVar41 = *(long *)((long)&(this->settings_).
                                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8);
      uVar45 = uVar3 + uVar48 & uVar44;
      local_98._M_head_impl =
           (basic_string_view<char,_std::char_traits<char>_> *)(lVar41 + uVar45 * 0x18);
      local_90._M_head_impl = (FieldDescriptorProto_Type *)(lVar41 + 0x10 + uVar45 * 0x18);
      local_88 = uVar44;
      local_80 = uVar49;
      local_58 = local_78;
      local_50 = this;
      bVar37 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
               ::EqualElement<char[5]>::operator()
                         ((EqualElement<char[5]> *)&local_58,local_98._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
                          &local_98,
                          (tuple<const_google::protobuf::FieldDescriptorProto_Type_&> *)&local_90);
      if (bVar37) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar42;
        pcVar42 = (this->settings_).
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (pcVar42 != (ctrl_t *)0x0) {
          pvVar2 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array.p;
          (__return_storage_ptr__->first).ctrl_ = pcVar42 + uVar45;
          (__return_storage_ptr__->first).field_1.slot_ =
               (slot_type *)(uVar45 * 0x18 + (long)pvVar2);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_001d644d;
      }
      uVar39 = (ushort)(uVar43 - 1) & (ushort)uVar43;
      uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar39);
      uVar44 = local_88;
      uVar49 = local_80;
      cVar21 = local_48;
      cVar22 = cStack_47;
      cVar23 = cStack_46;
      cVar24 = cStack_45;
      cVar25 = cStack_44;
      cVar26 = cStack_43;
      cVar27 = cStack_42;
      cVar28 = cStack_41;
      cVar29 = cStack_40;
      cVar30 = cStack_3f;
      cVar31 = cStack_3e;
      cVar32 = cStack_3d;
      cVar33 = cStack_3c;
      cVar34 = cStack_3b;
      cVar35 = cStack_3a;
      cVar36 = cStack_39;
      cVar5 = local_48;
      cVar6 = cStack_47;
      cVar7 = cStack_46;
      cVar8 = cStack_45;
      cVar9 = cStack_44;
      cVar10 = cStack_43;
      cVar11 = cStack_42;
      cVar12 = cStack_41;
      cVar13 = cStack_40;
      cVar14 = cStack_3f;
      cVar15 = cStack_3e;
      cVar16 = cStack_3d;
      cVar17 = cStack_3c;
      cVar18 = cStack_3b;
      cVar19 = cStack_3a;
      cVar20 = cStack_39;
    }
    auVar52[0] = -(local_48 == kEmpty);
    auVar52[1] = -(cStack_47 == kEmpty);
    auVar52[2] = -(cStack_46 == kEmpty);
    auVar52[3] = -(cStack_45 == kEmpty);
    auVar52[4] = -(cStack_44 == kEmpty);
    auVar52[5] = -(cStack_43 == kEmpty);
    auVar52[6] = -(cStack_42 == kEmpty);
    auVar52[7] = -(cStack_41 == kEmpty);
    auVar52[8] = -(cStack_40 == kEmpty);
    auVar52[9] = -(cStack_3f == kEmpty);
    auVar52[10] = -(cStack_3e == kEmpty);
    auVar52[0xb] = -(cStack_3d == kEmpty);
    auVar52[0xc] = -(cStack_3c == kEmpty);
    auVar52[0xd] = -(cStack_3b == kEmpty);
    auVar52[0xe] = -(cStack_3a == kEmpty);
    auVar52[0xf] = -(cStack_39 == kEmpty);
    uVar39 = (ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe | (ushort)(auVar52[0xf] >> 7) << 0xf;
    local_48 = cVar5;
    cStack_47 = cVar6;
    cStack_46 = cVar7;
    cStack_45 = cVar8;
    cStack_44 = cVar9;
    cStack_43 = cVar10;
    cStack_42 = cVar11;
    cStack_41 = cVar12;
    cStack_40 = cVar13;
    cStack_3f = cVar14;
    cStack_3e = cVar15;
    cStack_3d = cVar16;
    cStack_3c = cVar17;
    cStack_3b = cVar18;
    cStack_3a = cVar19;
    cStack_39 = cVar20;
    if (uVar39 == 0) {
      if ((this->settings_).
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ < local_b0 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar42;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>, K = char[5]]"
                     );
      }
      uVar48 = uVar48 + local_b0 + 0x10 & uVar44;
      local_b0 = local_b0 + 0x10;
    }
    else {
      cVar38 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         ((this->settings_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,uVar49,
                          (this->settings_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (cVar38 == '\0') {
        uVar43 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
          }
        }
      }
      else {
        uVar4 = 0xf;
        if (uVar39 != 0) {
          for (; uVar39 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar43 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      FVar53.offset = uVar43 + uVar48 & uVar44;
      FVar53.probe_length = local_b0;
      lVar41 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar49,FVar53,
                          (PolicyFunctions *)
                          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                          ::GetPolicyFunctions()::value);
      pcVar1 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      if (pcVar1 == (ctrl_t *)0x0) {
        (__return_storage_ptr__->first).field_1 = aVar46;
        __return_storage_ptr__->second = bVar47;
        (__return_storage_ptr__->first).ctrl_ = pcVar42;
LAB_001d644d:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>]"
                     );
      }
      pcVar42 = pcVar1 + lVar41;
      aVar46.slot_ = (slot_type *)
                     (lVar41 * 0x18 +
                     (long)(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array.p);
      bVar47 = true;
    }
    if (uVar39 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar46;
      __return_storage_ptr__->second = bVar47;
      (__return_storage_ptr__->first).ctrl_ = pcVar42;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }